

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strip_components.c
# Opt level: O0

void test_strip_components(void)

{
  wchar_t wVar1;
  char *in_RAX;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *in_stack_00000018;
  wchar_t in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  undefined4 in_stack_00000030;
  wchar_t in_stack_00000034;
  char *in_stack_00000038;
  wchar_t in_stack_00000094;
  char *in_stack_00000098;
  wchar_t in_stack_000000a4;
  char *in_stack_000000a8;
  char *pcVar2;
  
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_chdir(in_stack_00000008,unaff_retaddr_00,in_RAX);
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,in_RAX,L'\0');
  assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                      in_stack_00000020,in_stack_00000018);
  assertion_make_hardlink
            (in_stack_00000018,in_stack_00000014,in_stack_00000008,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_make_hardlink
            (in_stack_00000018,in_stack_00000014,in_stack_00000008,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,in_RAX,(char *)0x117c3e);
    assertion_make_symlink(in_stack_00000008,unaff_retaddr_00,in_RAX,(char *)0x117c5d);
  }
  assertion_chdir(in_stack_00000008,unaff_retaddr_00,in_RAX);
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    systemf("%s -cf test.tar d0/l1 d0/d1",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x117d0d,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  }
  else {
    systemf("%s -cf test.tar d0/l1 d0/s1 d0/d1",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x117cc5,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  }
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,pcVar2,L'\0');
  systemf("%s -x -C target --strip-components 2 -f test.tar",testprog);
  pcVar2 = (char *)0x0;
  assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                      (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x117d70,
                      (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  failure("d0/ is too short and should not get restored");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/d1/ is too short and should not get restored");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/s1 is too short and should not get restored");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/d1/s2 is a symlink to something that won\'t be extracted");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x117e31);
  }
  failure("d0/d1/d2 should be extracted");
  assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("d0/l1 is too short and should not get restored");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/d1/l2 is a hardlink to file whose name was too short");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/d1/d2/f1 is a hardlink to file whose name was too short");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    systemf("%s --strip-components 2 -cf test2.tar d0/l1 d0/d1",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x117f66,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  }
  else {
    systemf("%s --strip-components 2 -cf test2.tar d0/l1 d0/s1 d0/d1",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                        (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x117f1e,
                        (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  }
  assertion_make_dir(in_stack_00000008,unaff_retaddr_00,pcVar2,L'\0');
  systemf("%s -x -C target2 -f test2.tar",testprog);
  pcVar2 = (char *)0x0;
  assertion_equal_int(in_stack_00000018,in_stack_00000014,(longlong)in_stack_00000008,
                      (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),0,(char *)0x117fc9,
                      (void *)CONCAT44(in_stack_00000034,in_stack_00000030));
  failure("d0/ is too short and should not have been archived");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/d1/ is too short and should not have been archived");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/s1 is too short and should not get restored");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    failure("d0/d1/s2 is a symlink to something included in archive");
    assertion_is_symlink(in_stack_00000008,unaff_retaddr_00,pcVar2,(char *)0x118072);
  }
  failure("d0/d1/d2 should be archived");
  assertion_is_dir(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  failure("d0/l1 is too short and should not have been archived");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/d1/l2 is a hardlink to file whose name was too short");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  failure("d0/d1/d2/f1 is a hardlink to file whose name was too short");
  assertion_file_not_exists(in_stack_00000008,unaff_retaddr_00,pcVar2);
  return;
}

Assistant:

DEFINE_TEST(test_strip_components)
{
	assertMakeDir("d0", 0755);
	assertChdir("d0");
	assertMakeDir("d1", 0755);
	assertMakeDir("d1/d2", 0755);
	assertMakeDir("d1/d2/d3", 0755);
	assertMakeFile("d1/d2/f1", 0644, "");
	assertMakeHardlink("l1", "d1/d2/f1");
	assertMakeHardlink("d1/l2", "d1/d2/f1");
	if (canSymlink()) {
		assertMakeSymlink("s1", "d1/d2/f1");
		assertMakeSymlink("d1/s2", "d2/f1");
	}
	assertChdir("..");

	/*
	 * Test 1: Strip components when extracting archives.
	 */
	if (canSymlink())
		assertEqualInt(0, systemf("%s -cf test.tar d0/l1 d0/s1 d0/d1",
		    testprog));
	else
		assertEqualInt(0, systemf("%s -cf test.tar d0/l1 d0/d1",
		    testprog));

	assertMakeDir("target", 0755);
	assertEqualInt(0, systemf("%s -x -C target --strip-components 2 "
	    "-f test.tar", testprog));

	failure("d0/ is too short and should not get restored");
	assertFileNotExists("target/d0");
	failure("d0/d1/ is too short and should not get restored");
	assertFileNotExists("target/d1");
	failure("d0/s1 is too short and should not get restored");
	assertFileNotExists("target/s1");
	failure("d0/d1/s2 is a symlink to something that won't be extracted");
	/* If platform supports symlinks, target/s2 is a broken symlink. */
	/* If platform does not support symlink, target/s2 doesn't exist. */
	assertFileNotExists("target/s2");
	if (canSymlink())
		assertIsSymlink("target/s2", "d2/f1");
	failure("d0/d1/d2 should be extracted");
	assertIsDir("target/d2", -1);

	/*
	 * Test 1b: Strip components extracting archives involving hardlinks.
	 *
	 * This next is a complicated case.  d0/l1, d0/d1/l2, and
	 * d0/d1/d2/f1 are all hardlinks to the same file; d0/l1 can't
	 * be extracted with --strip-components=2 and the other two
	 * can.  Remember that tar normally stores the first file with
	 * a body and the other as hardlink entries to the first
	 * appearance.  So the final result depends on the order in
	 * which these three names get archived.  If d0/l1 is first,
	 * none of the three can be restored.  If either of the longer
	 * names are first, then the two longer ones can both be
	 * restored.  Note that the "tar -cf" command above explicitly
	 * lists d0/l1 before d0/d1.
	 *
	 * It may be worth extending this test to exercise other
	 * archiving orders.
	 *
	 * Of course, this is all totally different for cpio and newc
	 * formats because the hardlink management is different.
	 * TODO: Rename this to test_strip_components_tar and create
	 * parallel tests for cpio and newc formats.
	 */
	failure("d0/l1 is too short and should not get restored");
	assertFileNotExists("target/l1");
	failure("d0/d1/l2 is a hardlink to file whose name was too short");
	assertFileNotExists("target/l2");
	failure("d0/d1/d2/f1 is a hardlink to file whose name was too short");
	assertFileNotExists("target/d2/f1");

	/*
	 * Test 2: Strip components when creating archives.
	 */
	if (canSymlink())
		assertEqualInt(0, systemf("%s --strip-components 2 -cf test2.tar "
					"d0/l1 d0/s1 d0/d1", testprog));
	else
		assertEqualInt(0, systemf("%s --strip-components 2 -cf test2.tar "
					"d0/l1 d0/d1", testprog));

	assertMakeDir("target2", 0755);
	assertEqualInt(0, systemf("%s -x -C target2 -f test2.tar", testprog));

	failure("d0/ is too short and should not have been archived");
	assertFileNotExists("target2/d0");
	failure("d0/d1/ is too short and should not have been archived");
	assertFileNotExists("target2/d1");
	failure("d0/s1 is too short and should not get restored");
	assertFileNotExists("target/s1");
	/* If platform supports symlinks, target/s2 is included. */
	if (canSymlink()) {
		failure("d0/d1/s2 is a symlink to something included in archive");
		assertIsSymlink("target2/s2", "d2/f1");
	}
	failure("d0/d1/d2 should be archived");
	assertIsDir("target2/d2", -1);

	/*
	 * Test 2b: Strip components creating archives involving hardlinks.
	 */
	failure("d0/l1 is too short and should not have been archived");
	assertFileNotExists("target/l1");
	failure("d0/d1/l2 is a hardlink to file whose name was too short");
	assertFileNotExists("target/l2");
	failure("d0/d1/d2/f1 is a hardlink to file whose name was too short");
	assertFileNotExists("target/d2/f1");
}